

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
SmallArray<unsigned_char,_8U>::grow(SmallArray<unsigned_char,_8U> *this,uint newSize)

{
  Allocator *pAVar1;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  uchar *puVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar7 = (this->max >> 1) + this->max;
  uVar3 = newSize + 4;
  if (newSize < uVar7) {
    uVar3 = uVar7;
  }
  pAVar1 = this->allocator;
  if (pAVar1 == (Allocator *)0x0) {
    puVar5 = (uchar *)(*(code *)NULLC::alloc)(uVar3 + 4);
  }
  else {
    iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,(ulong)(uVar3 + 4));
    puVar5 = (uchar *)CONCAT44(extraout_var,iVar4);
  }
  if (this->count != 0) {
    uVar6 = 0;
    do {
      puVar5[uVar6] = this->data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->count);
  }
  puVar2 = this->data;
  if (puVar2 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (puVar2 != (uchar *)0x0) {
        (*(code *)NULLC::dealloc)(puVar2);
      }
    }
    else if (puVar2 != (uchar *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = puVar5;
  this->max = uVar3;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}